

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a9d::DataTransform<sptk::uint24_t,_int>::Run
          (DataTransform<sptk::uint24_t,_int> *this,istream *input_stream)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  istream *in_RSI;
  long in_RDI;
  bool bVar6;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 in_ST7;
  unkbyte10 Var7;
  ostringstream error_message;
  bool is_clipped;
  int output_data;
  invalid_argument *anon_var_0;
  string word;
  uint24_t input_data;
  int index;
  char buffer [128];
  ostream *in_stack_fffffffffffffcf8;
  undefined2 in_stack_fffffffffffffd00;
  undefined2 in_stack_fffffffffffffd02;
  undefined4 in_stack_fffffffffffffd04;
  undefined2 in_stack_fffffffffffffd08;
  undefined2 in_stack_fffffffffffffd0a;
  undefined2 in_stack_fffffffffffffd0c;
  undefined1 in_stack_fffffffffffffd0e;
  undefined1 in_stack_fffffffffffffd0f;
  allocator *in_stack_fffffffffffffd10;
  ostream *in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd20;
  allocator local_289;
  string local_288 [32];
  ostringstream local_268 [336];
  ostringstream *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  uint24_t local_eb;
  uint24_t local_e8;
  byte local_e5;
  int local_e4;
  uint24_t local_d3;
  uint local_d0;
  string local_c0 [33];
  uint24_t local_9f;
  int local_9c;
  char local_98 [128];
  istream *local_18;
  byte local_1;
  
  local_9c = 0;
  local_18 = in_RSI;
  do {
    sptk::uint24_t::uint24_t((uint24_t *)0x1576bc);
    if ((*(byte *)(in_RDI + 0x35) & 1) == 0) {
      bVar6 = sptk::ReadStream<sptk::uint24_t>
                        ((uint24_t *)
                         CONCAT17(in_stack_fffffffffffffd0f,
                                  CONCAT16(in_stack_fffffffffffffd0e,
                                           CONCAT24(in_stack_fffffffffffffd0c,
                                                    CONCAT22(in_stack_fffffffffffffd0a,
                                                             in_stack_fffffffffffffd08)))),
                         (istream *)
                         CONCAT44(in_stack_fffffffffffffd04,
                                  CONCAT22(in_stack_fffffffffffffd02,in_stack_fffffffffffffd00)));
      if (bVar6) goto LAB_00157862;
      local_d0 = 2;
    }
    else {
      std::__cxx11::string::string(local_c0);
      std::operator>>(local_18,local_c0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::stold((string *)
                            CONCAT44(in_stack_fffffffffffffd04,
                                     CONCAT22(in_stack_fffffffffffffd02,in_stack_fffffffffffffd00)),
                            (size_t *)in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffcf8 = (ostream *)in_ST0;
        in_stack_fffffffffffffd00 = (undefined2)((unkuint10)in_ST0 >> 0x40);
        Var7 = in_ST7;
        sptk::uint24_t::uint24_t<long_double>
                  ((uint24_t *)in_stack_fffffffffffffd10,
                   (longdouble)
                   CONCAT28(in_stack_fffffffffffffd08,
                            CONCAT44(in_stack_fffffffffffffd04,
                                     CONCAT22(in_stack_fffffffffffffd02,in_stack_fffffffffffffd00)))
                  );
        sptk::uint24_t::operator=(&local_9f,&local_d3);
        sptk::uint24_t::~uint24_t(&local_d3);
        local_d0 = 0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        in_ST7 = Var7;
      }
      else {
        local_d0 = 2;
      }
      std::__cxx11::string::~string(local_c0);
      if (local_d0 == 0) {
LAB_00157862:
        local_e4 = sptk::uint24_t::operator_cast_to_int(&local_9f);
        local_e5 = 0;
        if (*(int *)(in_RDI + 0x38) < *(int *)(in_RDI + 0x3c)) {
          if (*(int *)(in_RDI + 0x2c) == 1) {
            iVar1 = sptk::uint24_t::operator_cast_to_int(&local_9f);
            if (iVar1 < *(int *)(in_RDI + 0x38)) {
              local_e4 = *(int *)(in_RDI + 0x38);
              local_e5 = 1;
            }
            else {
              iVar1 = *(int *)(in_RDI + 0x3c);
              iVar2 = sptk::uint24_t::operator_cast_to_int(&local_9f);
              if (iVar1 < iVar2) {
                local_e4 = *(int *)(in_RDI + 0x3c);
                local_e5 = 1;
              }
            }
          }
          else if (*(int *)(in_RDI + 0x2c) == 2) {
            uVar3 = sptk::uint24_t::operator_cast_to_int(&local_9f);
            if (uVar3 < *(uint *)(in_RDI + 0x38)) {
              local_e4 = *(int *)(in_RDI + 0x38);
              local_e5 = 1;
            }
            else {
              uVar3 = *(uint *)(in_RDI + 0x3c);
              uVar4 = sptk::uint24_t::operator_cast_to_int(&local_9f);
              if (uVar3 < uVar4) {
                local_e4 = *(int *)(in_RDI + 0x3c);
                local_e5 = 1;
              }
            }
          }
          else if (*(int *)(in_RDI + 0x2c) == 3) {
            iVar1 = sptk::uint24_t::operator_cast_to_int(&local_9f);
            if ((longdouble)*(int *)(in_RDI + 0x38) <= (longdouble)iVar1) {
              iVar1 = *(int *)(in_RDI + 0x3c);
              iVar2 = sptk::uint24_t::operator_cast_to_int(&local_9f);
              in_ST6 = in_ST5;
              in_ST7 = in_ST5;
              if ((longdouble)iVar1 < (longdouble)iVar2) {
                local_e4 = *(int *)(in_RDI + 0x3c);
                local_e5 = 1;
              }
            }
            else {
              local_e4 = *(int *)(in_RDI + 0x38);
              local_e5 = 1;
              in_ST6 = in_ST5;
              in_ST7 = in_ST5;
            }
          }
        }
        if (((*(byte *)(in_RDI + 0x34) & 1) != 0) && ((local_e5 & 1) == 0)) {
          iVar1 = sptk::uint24_t::operator_cast_to_int(&local_9f);
          if ((double)iVar1 <= 0.0) {
            sptk::uint24_t::operator-
                      ((uint24_t *)
                       CONCAT17(in_stack_fffffffffffffd0f,
                                CONCAT16(in_stack_fffffffffffffd0e,
                                         CONCAT24(in_stack_fffffffffffffd0c,
                                                  CONCAT22(in_stack_fffffffffffffd0a,
                                                           in_stack_fffffffffffffd08)))),
                       (double)CONCAT44(in_stack_fffffffffffffd04,
                                        CONCAT22(in_stack_fffffffffffffd02,in_stack_fffffffffffffd00
                                                )));
            local_e4 = sptk::uint24_t::operator_cast_to_int(&local_eb);
            sptk::uint24_t::~uint24_t(&local_eb);
          }
          else {
            sptk::uint24_t::operator+
                      ((uint24_t *)
                       CONCAT17(in_stack_fffffffffffffd0f,
                                CONCAT16(in_stack_fffffffffffffd0e,
                                         CONCAT24(in_stack_fffffffffffffd0c,
                                                  CONCAT22(in_stack_fffffffffffffd0a,
                                                           in_stack_fffffffffffffd08)))),
                       (double)CONCAT44(in_stack_fffffffffffffd04,
                                        CONCAT22(in_stack_fffffffffffffd02,in_stack_fffffffffffffd00
                                                )));
            local_e4 = sptk::uint24_t::operator_cast_to_int(&local_e8);
            sptk::uint24_t::~uint24_t(&local_e8);
          }
        }
        if (((local_e5 & 1) != 0) && (*(int *)(in_RDI + 0x30) != 0)) {
          std::__cxx11::ostringstream::ostringstream(local_268);
          in_stack_fffffffffffffd18 = (ostream *)std::ostream::operator<<(local_268,local_9c);
          std::operator<<(in_stack_fffffffffffffd18,"th data is over the range of output type");
          in_stack_fffffffffffffd10 = &local_289;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_288,"x2x",in_stack_fffffffffffffd10);
          sptk::PrintErrorMessage(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          std::__cxx11::string::~string(local_288);
          std::allocator<char>::~allocator((allocator<char> *)&local_289);
          bVar6 = *(int *)(in_RDI + 0x30) == 2;
          if (bVar6) {
            local_1 = 0;
          }
          local_d0 = (uint)bVar6;
          std::__cxx11::ostringstream::~ostringstream(local_268);
          if (local_d0 != 0) goto LAB_00157d7f;
        }
        if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
          in_stack_fffffffffffffd0e =
               sptk::WriteStream<int>
                         (CONCAT22(in_stack_fffffffffffffd02,in_stack_fffffffffffffd00),
                          in_stack_fffffffffffffcf8);
          if ((bool)in_stack_fffffffffffffd0e) goto LAB_00157d74;
          local_1 = 0;
          local_d0 = 1;
        }
        else {
          in_stack_fffffffffffffd0f =
               sptk::SnPrintf<int>(in_stack_fffffffffffffd20,(string *)in_stack_fffffffffffffd18,
                                   (size_t)in_stack_fffffffffffffd10,
                                   (char *)CONCAT17(in_stack_fffffffffffffd0f,
                                                    CONCAT16(in_stack_fffffffffffffd0e,
                                                             CONCAT24(in_stack_fffffffffffffd0c,
                                                                      CONCAT22(
                                                  in_stack_fffffffffffffd0a,
                                                  in_stack_fffffffffffffd08)))));
          if ((bool)in_stack_fffffffffffffd0f) {
            std::operator<<((ostream *)&std::cout,local_98);
            if ((local_9c + 1) % *(int *)(in_RDI + 0x28) == 0) {
              std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            }
            else {
              std::operator<<((ostream *)&std::cout,"\t");
            }
LAB_00157d74:
            local_d0 = 0;
          }
          else {
            local_1 = 0;
            local_d0 = 1;
          }
        }
      }
    }
LAB_00157d7f:
    sptk::uint24_t::~uint24_t(&local_9f);
    in_stack_fffffffffffffd08 = (undefined2)local_d0;
    in_stack_fffffffffffffd0a = (undefined2)(local_d0 >> 0x10);
    if (local_d0 != 0) {
      if (local_d0 != 1) {
        if (((*(byte *)(in_RDI + 0x36) & 1) != 0) && (local_9c % *(int *)(in_RDI + 0x28) != 0)) {
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        local_1 = 1;
      }
      return (bool)(local_1 & 1);
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }